

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateDevice_Ex
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_UPDATE_EX *deviceUpdate)

{
  LOGGER_LOG p_Var1;
  undefined1 local_70 [8];
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_REGISTRY_DEVICE_UPDATE_EX *deviceUpdate_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if ((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
     (deviceUpdate == (IOTHUB_REGISTRY_DEVICE_UPDATE_EX *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateDevice_Ex",0x6e2,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((deviceUpdate->version < 1) || (1 < deviceUpdate->version)) {
    deviceOrModuleUpdate.managedBy = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)deviceOrModuleUpdate.managedBy != (LOGGER_LOG)0x0) {
      (*(code *)deviceOrModuleUpdate.managedBy)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                 ,"IoTHubRegistryManager_UpdateDevice_Ex",0x6e7,1,
                 "deviceUpdate must have valid version");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
  }
  else {
    memset(local_70,0,0x40);
    local_70._0_4_ = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
    if (0 < deviceUpdate->version) {
      deviceOrModuleUpdate._0_8_ = deviceUpdate->deviceId;
      deviceOrModuleUpdate.deviceId = deviceUpdate->primaryKey;
      deviceOrModuleUpdate.primaryKey = deviceUpdate->secondaryKey;
      deviceOrModuleUpdate.secondaryKey._0_4_ = deviceUpdate->status;
      deviceOrModuleUpdate.secondaryKey._4_4_ = deviceUpdate->authMethod;
      deviceOrModuleUpdate.status._0_1_ =
           deviceUpdate->iotEdge_capable & IOTHUB_DEVICE_STATUS_DISABLED;
    }
    l._4_4_ = IoTHubRegistryManager_UpdateDeviceOrModule
                        (registryManagerHandle,(IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *)local_70);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateDevice_Ex(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_DEVICE_UPDATE_EX* deviceUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (registryManagerHandle == NULL || deviceUpdate == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if (deviceUpdate->version < IOTHUB_REGISTRY_DEVICE_UPDATE_EX_VERSION_1 || deviceUpdate->version > IOTHUB_REGISTRY_DEVICE_UPDATE_EX_VERSION_LATEST)
    {
        LogError("deviceUpdate must have valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
        memset(&deviceOrModuleUpdate, 0, sizeof(deviceOrModuleUpdate));

        //Convert to generic update struct
        deviceOrModuleUpdate.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;

        if (deviceUpdate->version >= IOTHUB_REGISTRY_DEVICE_UPDATE_EX_VERSION_1)
        {
            deviceOrModuleUpdate.deviceId = deviceUpdate->deviceId;
            deviceOrModuleUpdate.primaryKey = deviceUpdate->primaryKey;
            deviceOrModuleUpdate.secondaryKey = deviceUpdate->secondaryKey;
            deviceOrModuleUpdate.status = deviceUpdate->status;
            deviceOrModuleUpdate.authMethod = deviceUpdate->authMethod;
            deviceOrModuleUpdate.iotEdge_capable = deviceUpdate->iotEdge_capable;
        }

        result = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle, &deviceOrModuleUpdate);
    }

    return result;
}